

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdrawhelper.cpp
# Opt level: O2

void qt_bitmapblit_rgb30<(QtPixelOrder)1>
               (QRasterBuffer *rasterBuffer,int x,int y,QRgba64 *color,uchar *map,int mapWidth,
               int mapHeight,int mapStride)

{
  uint color_00;
  
  color_00 = qConvertRgb64ToRgb30<(QtPixelOrder)1>((QRgba64)color->rgba);
  qt_bitmapblit_template<unsigned_int>(rasterBuffer,x,y,color_00,map,mapWidth,mapHeight,mapStride);
  return;
}

Assistant:

inline static void qt_bitmapblit_rgb30(QRasterBuffer *rasterBuffer,
                                   int x, int y, const QRgba64 &color,
                                   const uchar *map,
                                   int mapWidth, int mapHeight, int mapStride)
{
    qt_bitmapblit_template<quint32>(rasterBuffer, x, y, qConvertRgb64ToRgb30<PixelOrder>(color),
                                    map, mapWidth, mapHeight, mapStride);
}